

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_isBaseUnitImportedTwice_Test::TestBody(Units_isBaseUnitImportedTwice_Test *this)

{
  string *psVar1;
  char cVar2;
  byte bVar3;
  AssertionResult gtest_ar_;
  UnitsPtr u_i1;
  UnitsPtr u_i0;
  UnitsPtr u_i2;
  ImportSourcePtr i1;
  ImportSourcePtr i2;
  ModelPtr m_i2;
  ModelPtr m_i1;
  long *local_c0;
  AssertionResult local_b8;
  long local_a8 [2];
  AssertHelper local_98 [8];
  byte local_90 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  string *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  psVar1 = local_20;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"m_i1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::Model::create();
  psVar1 = local_30;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"m_i2","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::Units::create();
  libcellml::Units::create();
  libcellml::Units::create();
  psVar1 = local_70;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"some_other_u","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  psVar1 = local_80;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"u_i1","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"u_i2","");
  libcellml::NamedEntity::setName(local_60);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::Model::addUnits((shared_ptr *)local_20);
  libcellml::Model::addUnits((shared_ptr *)local_30);
  libcellml::ImportSource::create();
  psVar1 = local_40;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"I_am_a_url","");
  libcellml::ImportSource::setUrl(psVar1);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::ImportSource::setModel((shared_ptr *)local_40);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_80 + 0x10));
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"u_i2","");
  libcellml::ImportedEntity::setImportReference(local_80 + 0x10);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::ImportSource::create();
  psVar1 = local_50;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"I_am_another_url","");
  libcellml::ImportSource::setUrl(psVar1);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  libcellml::ImportSource::setModel((shared_ptr *)local_50);
  libcellml::ImportedEntity::setImportSource((shared_ptr *)(local_70 + 0x10));
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"u_i1","");
  libcellml::ImportedEntity::setImportReference(local_70 + 0x10);
  if ((long *)local_b8._0_8_ != local_a8) {
    operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
  }
  local_90[0] = libcellml::ImportedEntity::isImport();
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_90[0] == 0) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(char *)local_90,"u_i0->isImport()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8fe,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(local_98,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    if ((long *)local_b8._0_8_ != local_a8) {
      operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
    }
    if (local_c0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c0 != (long *)0x0)) {
        (**(code **)(*local_c0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90[0] = libcellml::ImportedEntity::isImport();
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_90[0] == 0) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(char *)local_90,"u_i1->isImport()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x8ff,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(local_98,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    if ((long *)local_b8._0_8_ != local_a8) {
      operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
    }
    if (local_c0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c0 != (long *)0x0)) {
        (**(code **)(*local_c0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = libcellml::ImportedEntity::isImport();
  local_90[0] = bVar3 ^ 1;
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(char *)local_90,"u_i2->isImport()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x900,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(local_98,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    if ((long *)local_b8._0_8_ != local_a8) {
      operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
    }
    if (local_c0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c0 != (long *)0x0)) {
        (**(code **)(*local_c0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_90[0] = libcellml::Units::isBaseUnit();
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_90[0] == 0) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(char *)local_90,"u_i0->isBaseUnit()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x901,(char *)local_b8._0_8_);
    testing::internal::AssertHelper::operator=(local_98,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    if ((long *)local_b8._0_8_ != local_a8) {
      operator_delete((void *)local_b8._0_8_,local_a8[0] + 1);
    }
    if (local_c0 != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_c0 != (long *)0x0)) {
        (**(code **)(*local_c0 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Units, isBaseUnitImportedTwice)
{
    libcellml::ModelPtr m_i1 = libcellml::Model::create();
    m_i1->setName("m_i1");
    libcellml::ModelPtr m_i2 = libcellml::Model::create();
    m_i2->setName("m_i2");

    libcellml::UnitsPtr u_i1 = libcellml::Units::create();
    libcellml::UnitsPtr u_i2 = libcellml::Units::create();
    libcellml::UnitsPtr u_i0 = libcellml::Units::create();

    u_i0->setName("some_other_u");
    u_i1->setName("u_i1");
    u_i2->setName("u_i2");

    m_i1->addUnits(u_i1);
    m_i2->addUnits(u_i2);

    libcellml::ImportSourcePtr i2 = libcellml::ImportSource::create();
    i2->setUrl("I_am_a_url");
    i2->setModel(m_i2);
    u_i1->setImportSource(i2);
    u_i1->setImportReference("u_i2");

    libcellml::ImportSourcePtr i1 = libcellml::ImportSource::create();
    i1->setUrl("I_am_another_url");
    i1->setModel(m_i1);
    u_i0->setImportSource(i1);
    u_i0->setImportReference("u_i1");

    EXPECT_TRUE(u_i0->isImport());
    EXPECT_TRUE(u_i1->isImport());
    EXPECT_FALSE(u_i2->isImport());
    EXPECT_TRUE(u_i0->isBaseUnit());
}